

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void av1_loop_restoration_filter_unit
               (RestorationTileLimits *limits,RestorationUnitInfo *rui,
               RestorationStripeBoundaries *rsb,RestorationLineBuffers *rlbs,int plane_w,int plane_h
               ,int ss_x,int ss_y,int highbd,int bit_depth,uint8_t *data8,int stride,uint8_t *dst8,
               int dst_stride,int32_t *tmpbuf,int optimized_lr,aom_internal_error_info *error_info)

{
  int iVar1;
  int use_highbd;
  uint8_t *data8_00;
  long lVar2;
  undefined8 in_RDX;
  RestorationUnitInfo *in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  byte in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  int in_stack_00000030;
  long in_stack_00000038;
  int h;
  int nominal_stripe_height;
  int rsb_row;
  int frame_stripe;
  int runit_offset;
  int full_stripe_height;
  int copy_below;
  int copy_above;
  int i;
  RestorationTileLimits remaining_stripes;
  int procunit_width;
  stripe_filter_fun stripe_filter;
  int in_stack_00000080;
  int filter_idx;
  uint8_t *dst8_tl;
  uint8_t *data8_tl;
  int unit_w;
  int unit_h;
  RestorationType unit_rtype;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  uint8_t *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff40;
  int local_b4;
  int local_b0;
  int local_90;
  int local_8c;
  int local_88;
  RestorationTileLimits local_84;
  int local_74;
  stripe_filter_fun local_70;
  int local_64;
  int in_stack_ffffffffffffffb0;
  RestorationType RVar3;
  
  RVar3 = in_RSI->restoration_type;
  iVar1 = in_RDI[3] - in_RDI[2];
  use_highbd = in_RDI[1] - *in_RDI;
  data8_00 = (uint8_t *)
             (in_stack_00000028 + (long)in_RDI[2] * (long)in_stack_00000030 + (long)*in_RDI);
  lVar2 = in_stack_00000038 + (long)in_RDI[2] * (long)h + (long)*in_RDI;
  if (RVar3 == RESTORE_NONE) {
    copy_rest_unit(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                   (uint8_t *)
                   CONCAT44((int)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_00000018),0,
                   in_stack_ffffffffffffff40);
  }
  else {
    local_64 = in_stack_00000018 * 2 + (uint)(RVar3 == RESTORE_SGRPROJ);
    local_70 = stripe_filters[local_64];
    local_74 = 0x40 >> (in_stack_00000008 & 0x1f);
    local_84.h_start = in_RDI[0];
    local_84.h_end = in_RDI[1];
    local_84.v_start = in_RDI[2];
    local_84.v_end = in_RDI[3];
    for (local_88 = 0; local_88 < iVar1; local_88 = local_b4 + local_88) {
      local_84.v_start = in_RDI[2] + local_88;
      get_stripe_boundary_info(&local_84,in_R8D,in_R9D,in_stack_00000010,&local_8c,&local_90);
      local_b4 = 0x40 >> ((byte)in_stack_00000010 & 0x1f);
      local_b0 = 8 >> ((byte)in_stack_00000010 & 0x1f);
      if ((local_84.v_start + local_b0) / local_b4 != 0) {
        local_b0 = 0;
      }
      local_b4 = local_b4 - local_b0;
      if (local_84.v_end - local_84.v_start <= local_b4) {
        local_b4 = local_84.v_end - local_84.v_start;
      }
      setup_processing_stripe_boundary
                (_i,(RestorationStripeBoundaries *)_copy_below,full_stripe_height,runit_offset,
                 frame_stripe,(uint8_t *)CONCAT44(nominal_stripe_height,h),remaining_stripes.v_end,
                 (RestorationLineBuffers *)stripe_filter,in_stack_00000080,(int)dst8_tl,
                 (int)data8_tl);
      (*local_70)(in_RSI,use_highbd,local_b4,local_74,data8_00 + local_88 * in_stack_00000030,
                  in_stack_00000030,(uint8_t *)(lVar2 + local_88 * h),h,
                  (int32_t *)CONCAT44(frame_stripe,rsb_row),in_stack_00000020,_copy_below);
      restore_processing_stripe_boundary
                ((RestorationTileLimits *)CONCAT44(in_R8D,in_R9D),
                 (RestorationLineBuffers *)CONCAT44(RVar3,iVar1),use_highbd,
                 in_stack_ffffffffffffffb0,data8_00,(int)((ulong)lVar2 >> 0x20),(int)in_RDX,
                 (int)in_RSI,(int)in_RDI);
    }
  }
  return;
}

Assistant:

void av1_loop_restoration_filter_unit(
    const RestorationTileLimits *limits, const RestorationUnitInfo *rui,
    const RestorationStripeBoundaries *rsb, RestorationLineBuffers *rlbs,
    int plane_w, int plane_h, int ss_x, int ss_y, int highbd, int bit_depth,
    uint8_t *data8, int stride, uint8_t *dst8, int dst_stride, int32_t *tmpbuf,
    int optimized_lr, struct aom_internal_error_info *error_info) {
  RestorationType unit_rtype = rui->restoration_type;

  int unit_h = limits->v_end - limits->v_start;
  int unit_w = limits->h_end - limits->h_start;
  uint8_t *data8_tl =
      data8 + limits->v_start * (ptrdiff_t)stride + limits->h_start;
  uint8_t *dst8_tl =
      dst8 + limits->v_start * (ptrdiff_t)dst_stride + limits->h_start;

  if (unit_rtype == RESTORE_NONE) {
    copy_rest_unit(unit_w, unit_h, data8_tl, stride, dst8_tl, dst_stride,
                   highbd);
    return;
  }

  const int filter_idx = 2 * highbd + (unit_rtype == RESTORE_SGRPROJ);
  assert(filter_idx < NUM_STRIPE_FILTERS);
  const stripe_filter_fun stripe_filter = stripe_filters[filter_idx];

  const int procunit_width = RESTORATION_PROC_UNIT_SIZE >> ss_x;

  // Filter the whole image one stripe at a time
  RestorationTileLimits remaining_stripes = *limits;
  int i = 0;
  while (i < unit_h) {
    int copy_above, copy_below;
    remaining_stripes.v_start = limits->v_start + i;

    get_stripe_boundary_info(&remaining_stripes, plane_w, plane_h, ss_y,
                             &copy_above, &copy_below);

    const int full_stripe_height = RESTORATION_PROC_UNIT_SIZE >> ss_y;
    const int runit_offset = RESTORATION_UNIT_OFFSET >> ss_y;

    // Work out where this stripe's boundaries are within
    // rsb->stripe_boundary_{above,below}
    const int frame_stripe =
        (remaining_stripes.v_start + runit_offset) / full_stripe_height;
    const int rsb_row = RESTORATION_CTX_VERT * frame_stripe;

    // Calculate this stripe's height, based on two rules:
    // * The topmost stripe in the frame is 8 luma pixels shorter than usual.
    // * We can't extend past the end of the current restoration unit
    const int nominal_stripe_height =
        full_stripe_height - ((frame_stripe == 0) ? runit_offset : 0);
    const int h = AOMMIN(nominal_stripe_height,
                         remaining_stripes.v_end - remaining_stripes.v_start);

    setup_processing_stripe_boundary(&remaining_stripes, rsb, rsb_row, highbd,
                                     h, data8, stride, rlbs, copy_above,
                                     copy_below, optimized_lr);

    stripe_filter(rui, unit_w, h, procunit_width, data8_tl + i * stride, stride,
                  dst8_tl + i * dst_stride, dst_stride, tmpbuf, bit_depth,
                  error_info);

    restore_processing_stripe_boundary(&remaining_stripes, rlbs, highbd, h,
                                       data8, stride, copy_above, copy_below,
                                       optimized_lr);

    i += h;
  }
}